

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_end_encoding
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  OPJ_BYTE *pOVar1;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x32e4,
                  "OPJ_BOOL opj_j2k_end_encoding(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager != (opj_event_mgr *)0x0) {
    if (p_stream != (opj_stream_private *)0x0) {
      opj_tcd_destroy(p_j2k->m_tcd);
      p_j2k->m_tcd = (opj_tcd *)0x0;
      pOVar1 = (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_buffer;
      if (pOVar1 != (OPJ_BYTE *)0x0) {
        opj_free(pOVar1);
        (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_buffer = (OPJ_BYTE *)0x0;
        (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current = (OPJ_BYTE *)0x0;
      }
      pOVar1 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data;
      if (pOVar1 != (OPJ_BYTE *)0x0) {
        opj_free(pOVar1);
        (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = (OPJ_BYTE *)0x0;
      }
      (p_j2k->m_specific_param).m_encoder.m_encoded_tile_size = 0;
      return 1;
    }
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x32e6,
                  "OPJ_BOOL opj_j2k_end_encoding(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x32e5,
                "OPJ_BOOL opj_j2k_end_encoding(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_end_encoding(opj_j2k_t *p_j2k,
                                     struct opj_stream_private *p_stream,
                                     struct opj_event_mgr * p_manager)
{
    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    OPJ_UNUSED(p_stream);
    OPJ_UNUSED(p_manager);

    opj_tcd_destroy(p_j2k->m_tcd);
    p_j2k->m_tcd = 00;

    if (p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer) {
        opj_free(p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer);
        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer = 0;
        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current = 0;
    }

    if (p_j2k->m_specific_param.m_encoder.m_encoded_tile_data) {
        opj_free(p_j2k->m_specific_param.m_encoder.m_encoded_tile_data);
        p_j2k->m_specific_param.m_encoder.m_encoded_tile_data = 0;
    }

    p_j2k->m_specific_param.m_encoder.m_encoded_tile_size = 0;

    return OPJ_TRUE;
}